

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void SortSetHelper(StringItem *list,Var item,uint32 index,JsReentLock *jsReentLock,
                  ScriptContext *scriptContext)

{
  JavascriptString *ptr;
  undefined1 auStack_68 [8];
  StringItem current;
  JsReentLock lock;
  
  auStack_68 = (undefined1  [8])0x0;
  current.Value.ptr = (void *)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet((WriteBarrierPtr<void> *)auStack_68,item);
  current.StringValue.ptr = (JavascriptString *)jsReentLock->m_threadContext;
  lock.m_arrayObject2._0_1_ = SUB81(*(undefined8 *)&jsReentLock->m_savedNoJsReentrancy,0);
  ((ThreadContext *)current.StringValue.ptr)->noJsReentrancy = lock.m_arrayObject2._0_1_;
  ptr = Js::JavascriptConversion::ToString(item,scriptContext);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptString> *)&current,ptr);
  JsReentLock::MutateArrayObject((JsReentLock *)&current.StringValue);
  *(undefined1 *)&current.StringValue.ptr[8].super_RecyclableObject.type.ptr = 1;
  StringItem::operator=(list + index,(StringItem *)auStack_68);
  *(bool *)&current.StringValue.ptr[8].super_RecyclableObject.type.ptr = lock.m_arrayObject2._0_1_;
  return;
}

Assistant:

inline void SortSetHelper(StringItem* list, Var item, uint32 index, JsReentLock* jsReentLock, ScriptContext* scriptContext)
    {
        StringItem current;
        current.Value = item;
        JsReentLock lock = *jsReentLock;
        JS_REENTRANT(lock, current.StringValue = JavascriptConversion::ToString(item, scriptContext));
        list[index] = current;
    }